

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

int conn_upkeep(Curl_easy *data,connectdata *conn,void *param)

{
  undefined8 uVar1;
  undefined4 uVar2;
  timediff_t tVar3;
  curltime older;
  curltime newer;
  curltime *now;
  void *param_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  uVar1 = (conn->keepalive).tv_sec;
  uVar2 = (conn->keepalive).tv_usec;
  older.tv_usec = uVar2;
  older.tv_sec = uVar1;
  older._12_4_ = 0;
  newer._12_4_ = 0;
  newer._0_12_ = *param;
  tVar3 = Curl_timediff(newer,older);
  if ((data->set).upkeep_interval_ms < tVar3) {
    Curl_attach_connection(data,conn);
    if (conn->handler->connection_check == (_func_uint_Curl_easy_ptr_connectdata_ptr_uint *)0x0) {
      Curl_conn_keep_alive(data,conn,0);
    }
    else {
      (*conn->handler->connection_check)(data,conn,2);
    }
    Curl_detach_connection(data);
    (conn->keepalive).tv_sec = *param;
    *(undefined8 *)&(conn->keepalive).tv_usec = *(undefined8 *)((long)param + 8);
  }
  return 0;
}

Assistant:

static int conn_upkeep(struct Curl_easy *data,
                       struct connectdata *conn,
                       void *param)
{
  struct curltime *now = param;

  if(Curl_timediff(*now, conn->keepalive) <= data->set.upkeep_interval_ms)
    return 0;

  /* briefly attach for action */
  Curl_attach_connection(data, conn);
  if(conn->handler->connection_check) {
    /* Do a protocol-specific keepalive check on the connection. */
    conn->handler->connection_check(data, conn, CONNCHECK_KEEPALIVE);
  }
  else {
    /* Do the generic action on the FIRSTSOCKE filter chain */
    Curl_conn_keep_alive(data, conn, FIRSTSOCKET);
  }
  Curl_detach_connection(data);

  conn->keepalive = *now;
  return 0; /* continue iteration */
}